

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-error.c
# Opt level: O3

int run_test_pipe_connect_bad_name(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  int iVar3;
  long *plVar4;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_connect_t req;
  uv_pipe_t client;
  long lStack_c68;
  long lStack_c60;
  undefined1 auStack_c58 [104];
  undefined1 auStack_bf0 [232];
  undefined1 auStack_b08 [2047];
  undefined1 uStack_309;
  code *pcStack_308;
  undefined8 uStack_2f8;
  code *pcStack_2f0;
  long lStack_2e8;
  long lStack_2e0;
  long alStack_2d8 [13];
  undefined1 auStack_270 [232];
  code *pcStack_188;
  undefined8 uStack_178;
  code *pcStack_170;
  long local_168;
  long local_160;
  long local_158 [13];
  undefined1 local_f0 [232];
  
  plVar4 = &local_168;
  pcStack_170 = (code *)0x1b0d5d;
  uVar2 = uv_default_loop();
  pcStack_170 = (code *)0x1b0d6c;
  iVar1 = uv_pipe_init(uVar2,local_f0,0);
  local_158[0] = (long)iVar1;
  local_168 = 0;
  if (local_158[0] == 0) {
    pcStack_170 = (code *)0x1b0da7;
    uv_pipe_connect(local_158,local_f0,"/path/to/unix/socket/that/really/should/not/be/there",
                    connect_cb);
    pcStack_170 = (code *)0x1b0dac;
    uVar2 = uv_default_loop();
    pcStack_170 = (code *)0x1b0db6;
    uv_run(uVar2,0);
    local_168 = 1;
    local_160 = (long)close_cb_called;
    if (local_160 != 1) goto LAB_001b0e5f;
    local_168 = 1;
    local_160 = (long)connect_cb_called;
    if (local_160 != 1) goto LAB_001b0e6c;
    pcStack_170 = (code *)0x1b0dfd;
    unaff_RBX = uv_default_loop();
    pcStack_170 = (code *)0x1b0e11;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_170 = (code *)0x1b0e1b;
    uv_run(unaff_RBX,0);
    local_168 = 0;
    pcStack_170 = (code *)0x1b0e28;
    uVar2 = uv_default_loop();
    pcStack_170 = (code *)0x1b0e30;
    iVar1 = uv_loop_close(uVar2);
    local_160 = (long)iVar1;
    if (local_168 == local_160) {
      pcStack_170 = (code *)0x1b0e47;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_170 = (code *)0x1b0e5f;
    run_test_pipe_connect_bad_name_cold_1();
LAB_001b0e5f:
    pcStack_170 = (code *)0x1b0e6c;
    run_test_pipe_connect_bad_name_cold_2();
LAB_001b0e6c:
    pcStack_170 = (code *)0x1b0e79;
    run_test_pipe_connect_bad_name_cold_3();
  }
  iVar1 = (int)&local_160;
  pcStack_170 = connect_cb;
  run_test_pipe_connect_bad_name_cold_4();
  pcStack_170 = (code *)(long)iVar1;
  uStack_178 = 0xfffffffffffffffe;
  if (pcStack_170 == (code *)0xfffffffffffffffe) {
    pcStack_188 = (code *)0x1b0eb7;
    iVar1 = uv_close(*(undefined8 *)((long)plVar4 + 0x50),close_cb);
    connect_cb_called = connect_cb_called + 1;
    return iVar1;
  }
  pcStack_188 = run_test_pipe_connect_to_file;
  connect_cb_cold_1();
  plVar4 = &lStack_2e8;
  pcStack_2f0 = (code *)0x1b0ede;
  pcStack_188 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_2f0 = (code *)0x1b0eed;
  iVar1 = uv_pipe_init(uVar2,auStack_270,0);
  alStack_2d8[0] = (long)iVar1;
  lStack_2e8 = 0;
  if (alStack_2d8[0] == 0) {
    pcStack_2f0 = (code *)0x1b0f28;
    uv_pipe_connect(alStack_2d8,auStack_270,"test/fixtures/empty_file",connect_cb_file);
    pcStack_2f0 = (code *)0x1b0f2d;
    uVar2 = uv_default_loop();
    pcStack_2f0 = (code *)0x1b0f37;
    uv_run(uVar2,0);
    lStack_2e8 = 1;
    lStack_2e0 = (long)close_cb_called;
    if (lStack_2e0 != 1) goto LAB_001b0fe0;
    lStack_2e8 = 1;
    lStack_2e0 = (long)connect_cb_called;
    if (lStack_2e0 != 1) goto LAB_001b0fed;
    pcStack_2f0 = (code *)0x1b0f7e;
    unaff_RBX = uv_default_loop();
    pcStack_2f0 = (code *)0x1b0f92;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_2f0 = (code *)0x1b0f9c;
    uv_run(unaff_RBX,0);
    lStack_2e8 = 0;
    pcStack_2f0 = (code *)0x1b0fa9;
    uVar2 = uv_default_loop();
    pcStack_2f0 = (code *)0x1b0fb1;
    iVar1 = uv_loop_close(uVar2);
    lStack_2e0 = (long)iVar1;
    if (lStack_2e8 == lStack_2e0) {
      pcStack_2f0 = (code *)0x1b0fc8;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_2f0 = (code *)0x1b0fe0;
    run_test_pipe_connect_to_file_cold_1();
LAB_001b0fe0:
    pcStack_2f0 = (code *)0x1b0fed;
    run_test_pipe_connect_to_file_cold_2();
LAB_001b0fed:
    pcStack_2f0 = (code *)0x1b0ffa;
    run_test_pipe_connect_to_file_cold_3();
  }
  iVar1 = (int)&lStack_2e0;
  pcStack_2f0 = connect_cb_file;
  run_test_pipe_connect_to_file_cold_4();
  if ((iVar1 == -0x58) || (iVar1 == -0xd)) {
LAB_001b1032:
    pcStack_308 = (code *)0x1b1042;
    iVar1 = uv_close(*(undefined8 *)((long)plVar4 + 0x50),close_cb);
    connect_cb_called = connect_cb_called + 1;
    return iVar1;
  }
  pcStack_2f0 = (code *)(long)iVar1;
  uStack_2f8 = 0xffffffffffffff91;
  if (pcStack_2f0 == (code *)0xffffffffffffff91) goto LAB_001b1032;
  pcStack_308 = run_test_pipe_connect_to_long_path;
  connect_cb_file_cold_1();
  iVar3 = (int)&lStack_c68;
  pcStack_308 = (code *)unaff_RBX;
  memset(auStack_b08,0x2e,0x7ff);
  uStack_309 = 0;
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,auStack_bf0,0);
  if (iVar1 == 0) {
    uv_pipe_connect(auStack_c58,auStack_bf0,auStack_b08,connect_cb_long_path);
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (close_cb_called != 1) goto LAB_001b113f;
    if (connect_cb_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      lStack_c60 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      lStack_c68 = (long)iVar1;
      if (lStack_c60 == lStack_c68) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b1149;
    }
  }
  else {
    run_test_pipe_connect_to_long_path_cold_1();
LAB_001b113f:
    run_test_pipe_connect_to_long_path_cold_2();
  }
  run_test_pipe_connect_to_long_path_cold_3();
LAB_001b1149:
  plVar4 = &lStack_c60;
  run_test_pipe_connect_to_long_path_cold_4();
  if (iVar3 == -0x24) {
    uv_close(plVar4[10],close_cb);
    connect_cb_called = connect_cb_called + 1;
    return extraout_EAX;
  }
  connect_cb_long_path_cold_1();
  if (plVar4 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_connect_bad_name) {
  uv_pipe_t client;
  uv_connect_t req;
  int r;

  r = uv_pipe_init(uv_default_loop(), &client, 0);
  ASSERT_OK(r);
  uv_pipe_connect(&req, &client, BAD_PIPENAME, connect_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);
  ASSERT_EQ(1, connect_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}